

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall asmjit::BaseAssembler::onAttach(BaseAssembler *this,CodeHolder *code)

{
  Section *pSVar1;
  uint8_t *puVar2;
  Error EVar3;
  Section **ppSVar4;
  
  EVar3 = BaseEmitter::onAttach(&this->super_BaseEmitter,code);
  if (EVar3 == 0) {
    ppSVar4 = ZoneVector<asmjit::Section_*>::operator[](&code->_sections,0);
    pSVar1 = *ppSVar4;
    puVar2 = (pSVar1->_buffer)._data;
    this->_section = pSVar1;
    this->_bufferData = puVar2;
    this->_bufferPtr = puVar2 + (pSVar1->_buffer)._size;
    this->_bufferEnd = puVar2 + (pSVar1->_buffer)._capacity;
  }
  return EVar3;
}

Assistant:

Error BaseAssembler::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));

  // Attach to the end of the .text section.
  BaseAssembler_initSection(this, code->_sections[0]);

  return kErrorOk;
}